

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  ZSTD_ErrorCode ZVar4;
  ulong uVar5;
  XXH64_hash_t XVar6;
  byte *src_00;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  size_t sVar12;
  uint *src_01;
  uint *puVar13;
  size_t sVar14;
  blockProperties_t local_64;
  void *local_58;
  size_t local_50;
  undefined8 local_48;
  size_t local_40;
  void *local_38;
  
  local_40 = dictSize;
  local_58 = dict;
  local_50 = dstCapacity;
  if (ddict != (ZSTD_DDict *)0x0) {
    local_58 = ZSTD_DDict_dictContent(ddict);
    local_40 = ZSTD_DDict_dictSize(ddict);
  }
  local_38 = dst;
  if (4 < srcSize) {
    uVar11 = 0;
    sVar14 = srcSize;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        if (sVar14 < 8) {
          return 0xffffffffffffffb8;
        }
        if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
          return 0xfffffffffffffff2;
        }
        uVar9 = (ulong)*(uint *)((long)src + 4) + 8;
        srcSize = sVar14 - uVar9;
        if (sVar14 < uVar9) {
          return 0xffffffffffffffb8;
        }
        puVar13 = (uint *)((long)src + uVar9);
      }
      else {
        if (ddict == (ZSTD_DDict *)0x0) {
          sVar12 = ZSTD_decompressBegin_usingDict(dctx,local_58,local_40);
          if (0xffffffffffffff88 < sVar12) {
            return sVar12;
          }
        }
        else {
          ZSTD_decompressBegin_usingDDict(dctx,ddict);
        }
        pvVar7 = dctx->previousDstEnd;
        if (pvVar7 != dst) {
          dctx->dictEnd = pvVar7;
          dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar7) + (long)dst);
          dctx->prefixStart = dst;
          dctx->previousDstEnd = dst;
        }
        local_48 = uVar11;
        puVar13 = (uint *)src;
        srcSize = sVar14;
        if (sVar14 < 9) {
LAB_003fb97c:
          uVar9 = 0xffffffffffffffb8;
        }
        else {
          bVar2 = (byte)*(uint *)((long)src + 4);
          lVar1 = ZSTD_did_fieldSize[bVar2 & 3] +
                  *(long *)((long)ZSTD_fcs_fieldSize + (ulong)(bVar2 >> 3 & 0x18)) +
                  (ulong)((bVar2 & 0x20) == 0) + (ulong)(bVar2 < 0x40 & (byte)((bVar2 & 0x20) >> 5))
          ;
          uVar10 = lVar1 + 5;
          uVar9 = uVar10;
          if (uVar10 < 0xffffffffffffff89) {
            if (sVar14 < lVar1 + 8U) goto LAB_003fb97c;
            uVar9 = ZSTD_decodeFrameHeader(dctx,src,uVar10);
            if (uVar9 < 0xffffffffffffff89) {
              src_01 = (uint *)((long)src + uVar10);
              sVar12 = sVar14 - uVar10;
              uVar10 = ZSTD_getcBlockSize(src_01,sVar12,&local_64);
              sVar3 = local_50;
              pvVar7 = dst;
              while (uVar9 = uVar10, uVar10 < 0xffffffffffffff89) {
                uVar5 = sVar12 - 3;
                sVar12 = uVar5 - uVar10;
                if (uVar5 < uVar10) goto LAB_003fb97c;
                src_00 = (byte *)((long)src_01 + 3);
                if (local_64.blockType == bt_compressed) {
                  uVar9 = ZSTD_decompressBlock_internal
                                    (dctx,pvVar7,(long)dst + (sVar3 - (long)pvVar7),src_00,uVar10,1)
                  ;
                  if (0xffffffffffffff88 < uVar9) break;
                }
                else if (local_64.blockType == bt_rle) {
                  uVar9 = (ulong)local_64.origSize;
                  if (pvVar7 == (void *)0x0) {
joined_r0x003fbb0e:
                    if (uVar9 != 0) {
                      uVar9 = 0xffffffffffffffb6;
                      break;
                    }
                    uVar9 = 0;
                  }
                  else {
                    if ((long)dst + (sVar3 - (long)pvVar7) < uVar9) {
LAB_003fbc3c:
                      uVar9 = 0xffffffffffffffba;
                      break;
                    }
                    memset(pvVar7,(uint)*src_00,uVar9);
                  }
                }
                else {
                  if (local_64.blockType != bt_raw) {
                    uVar9 = 0xffffffffffffffec;
                    break;
                  }
                  if (pvVar7 == (void *)0x0) goto joined_r0x003fbb0e;
                  if ((long)dst + (sVar3 - (long)pvVar7) < uVar10) goto LAB_003fbc3c;
                  memcpy(pvVar7,src_00,uVar10);
                }
                if ((dctx->fParams).checksumFlag != 0) {
                  XXH64_update(&dctx->xxhState,pvVar7,uVar9);
                }
                pvVar7 = (void *)((long)pvVar7 + uVar9);
                src_01 = (uint *)(src_00 + uVar10);
                if (local_64.lastBlock != 0) {
                  sVar3 = (dctx->fParams).frameContentSize;
                  sVar8 = (long)pvVar7 - (long)dst;
                  if (((sVar3 == 0xffffffffffffffff) || (uVar9 = 0xffffffffffffffec, sVar8 == sVar3)
                      ) && (uVar9 = sVar8, puVar13 = src_01, srcSize = sVar12,
                           (dctx->fParams).checksumFlag != 0)) {
                    XVar6 = XXH64_digest(&dctx->xxhState);
                    uVar9 = 0xffffffffffffffea;
                    puVar13 = (uint *)src;
                    srcSize = sVar14;
                    if ((3 < sVar12) && (*src_01 == (uint)XVar6)) {
                      uVar9 = sVar8;
                      puVar13 = src_01 + 1;
                      srcSize = sVar12 - 4;
                    }
                  }
                  break;
                }
                uVar10 = ZSTD_getcBlockSize(src_01,sVar12,&local_64);
              }
            }
          }
        }
        ZVar4 = ZSTD_getErrorCode(uVar9);
        if (((byte)local_48 & ZVar4 == ZSTD_error_prefix_unknown) != 0) {
          return 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar9) {
          return uVar9;
        }
        dst = (void *)((long)dst + uVar9);
        local_50 = local_50 - uVar9;
        uVar11 = CONCAT71((int7)(uVar9 >> 8),1);
      }
      src = puVar13;
      sVar14 = srcSize;
    } while (4 < srcSize);
  }
  sVar14 = 0xffffffffffffffb8;
  if (srcSize == 0) {
    sVar14 = (long)dst - (long)local_38;
  }
  return sVar14;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_FRAMEHEADERSIZE_PREFIX) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            /* legacy support is not compatible with static dctx */
            if (dctx->staticSize) return ERROR(memory_allocation);

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <=- dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                if (ZSTD_isError(skippableSize))
                    return skippableSize;
                if (srcSize < skippableSize) return ERROR(srcSize_wrong);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            CHECK_F(ZSTD_decompressBegin_usingDDict(dctx, ddict));
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            CHECK_F(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize));
        }
        ZSTD_checkContinuity(dctx, dst);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            if ( (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
              && (moreThan1Frame==1) ) {
                /* at least one frame successfully completed,
                 * but following bytes are garbage :
                 * it's more likely to be a srcSize error,
                 * specifying more bytes than compressed size of frame(s).
                 * This error message replaces ERROR(prefix_unknown),
                 * which would be confusing, as the first header is actually correct.
                 * Note that one could be unlucky, it might be a corruption error instead,
                 * happening right at the place where we expect zstd magic bytes.
                 * But this is _much_ less likely than a srcSize field error. */
                return ERROR(srcSize_wrong);
            }
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ERROR(srcSize_wrong); /* input not entirely consumed */

    return (BYTE*)dst - (BYTE*)dststart;
}